

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStringObject.cpp
# Opt level: O0

PropertyQueryFlags __thiscall
Js::JavascriptStringObject::GetPropertyQuery
          (JavascriptStringObject *this,Var originalInstance,PropertyId propertyId,Var *value,
          PropertyValueInfo *info,ScriptContext *requestContext)

{
  bool bVar1;
  PropertyQueryFlags val;
  BOOL BVar2;
  JavascriptString *pJVar3;
  Var aValue;
  RecyclableObject *pRVar4;
  JavascriptString *str;
  ScriptContext *pSStack_50;
  uint32 index;
  ScriptContext *scriptContext;
  ScriptContext *pSStack_40;
  BOOL result;
  ScriptContext *requestContext_local;
  PropertyValueInfo *info_local;
  Var *value_local;
  Var pvStack_20;
  PropertyId propertyId_local;
  Var originalInstance_local;
  JavascriptStringObject *this_local;
  
  pSStack_40 = requestContext;
  requestContext_local = (ScriptContext *)info;
  info_local = (PropertyValueInfo *)value;
  value_local._4_4_ = propertyId;
  pvStack_20 = originalInstance;
  originalInstance_local = this;
  bVar1 = GetPropertyBuiltIns(this,propertyId,value,requestContext,
                              (BOOL *)((long)&scriptContext + 4));
  if (bVar1) {
    this_local._4_4_ = JavascriptConversion::BooleanToPropertyQueryFlags(scriptContext._4_4_);
  }
  else {
    val = DynamicObject::GetPropertyQuery
                    (&this->super_DynamicObject,pvStack_20,value_local._4_4_,&info_local->m_instance
                     ,(PropertyValueInfo *)requestContext_local,pSStack_40);
    BVar2 = JavascriptConversion::PropertyQueryFlagsToBoolean(val);
    if (BVar2 == 0) {
      pSStack_50 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
      BVar2 = ScriptContext::IsNumericPropertyId
                        (pSStack_50,value_local._4_4_,(uint32 *)((long)&str + 4));
      if (BVar2 == 0) {
        pRVar4 = ScriptContext::GetMissingPropertyResult(pSStack_40);
        info_local->m_instance = pRVar4;
        this_local._4_4_ = Property_NotFound;
      }
      else {
        pJVar3 = InternalUnwrap(this);
        aValue = CrossSite::MarshalVar(pSStack_40,pJVar3,pSStack_50);
        pJVar3 = VarTo<Js::JavascriptString>(aValue);
        BVar2 = JavascriptString::GetItemAt(pJVar3,str._4_4_,&info_local->m_instance);
        this_local._4_4_ = JavascriptConversion::BooleanToPropertyQueryFlags(BVar2);
      }
    }
    else {
      this_local._4_4_ = Property_Found;
    }
  }
  return this_local._4_4_;
}

Assistant:

PropertyQueryFlags JavascriptStringObject::GetPropertyQuery(Var originalInstance, PropertyId propertyId, Var* value, PropertyValueInfo* info, ScriptContext* requestContext)
    {
        BOOL result;
        if (GetPropertyBuiltIns(propertyId, value, requestContext, &result))
        {
            return JavascriptConversion::BooleanToPropertyQueryFlags(result);
        }

        if (JavascriptConversion::PropertyQueryFlagsToBoolean(DynamicObject::GetPropertyQuery(originalInstance, propertyId, value, info, requestContext)))
        {
            return PropertyQueryFlags::Property_Found;
        }

        // For NumericPropertyIds check that index is less than JavascriptString length
        ScriptContext*scriptContext = GetScriptContext();
        uint32 index;
        if (scriptContext->IsNumericPropertyId(propertyId, &index))
        {
            JavascriptString* str = this->InternalUnwrap();
            str = VarTo<JavascriptString>(CrossSite::MarshalVar(requestContext, str, scriptContext));

            return JavascriptConversion::BooleanToPropertyQueryFlags(str->GetItemAt(index, value));
        }

        *value = requestContext->GetMissingPropertyResult();
        return PropertyQueryFlags::Property_NotFound;
    }